

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O2

string * __thiscall
TgBot::HttpParser::generateMultipartBoundary_abi_cxx11_
          (string *__return_storage_ptr__,HttpParser *this,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args)

{
  pointer pHVar1;
  time_t tVar2;
  size_t extraout_RDX;
  size_t length;
  size_t extraout_RDX_00;
  pointer pHVar3;
  undefined1 auVar4 [16];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  pHVar3 = (args->super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pHVar1 = (args->super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  length = extraout_RDX;
  while( true ) {
    if (pHVar3 == pHVar1) {
      return __return_storage_ptr__;
    }
    if (pHVar3->isFile == true) break;
LAB_0020b6c4:
    pHVar3 = pHVar3 + 1;
  }
  do {
    if (__return_storage_ptr__->_M_string_length != 0) {
      auVar4 = std::__cxx11::string::find((string *)&pHVar3->value,(ulong)__return_storage_ptr__);
      length = auVar4._8_8_;
      if (auVar4._0_8_ == -1) goto LAB_0020b6c4;
    }
    StringTools::generateRandomString_abi_cxx11_(&local_50,(StringTools *)0x4,length);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    length = extraout_RDX_00;
  } while( true );
}

Assistant:

string HttpParser::generateMultipartBoundary(const vector<HttpReqArg>& args) const {
    string result;
    srand((uint32_t) time(nullptr));
    for (const HttpReqArg& item : args) {
        if (item.isFile) {
            while (result.empty() || item.value.find(result) != string::npos) {
                result += StringTools::generateRandomString(4);
            }
        }
    }
    return result;
}